

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardImpl.cpp
# Opt level: O0

bool anon_unknown.dwarf_15f1d1::isKeyPressedImpl(KeyCode keycode)

{
  Display *pDVar1;
  byte in_DIL;
  char keys [32];
  Display *display;
  char local_38 [8];
  Display *in_stack_ffffffffffffffd0;
  bool local_1;
  
  if (in_DIL == 0) {
    local_1 = false;
  }
  else {
    pDVar1 = sf::priv::OpenDisplay();
    XQueryKeymap(pDVar1,local_38);
    sf::priv::CloseDisplay(in_stack_ffffffffffffffd0);
    local_1 = ((int)local_38[(int)(in_DIL / 8)] & 1 << in_DIL % 8) != 0;
  }
  return local_1;
}

Assistant:

bool isKeyPressedImpl(KeyCode keycode)
{
    if (keycode != NullKeyCode)
    {
        Display* display = sf::priv::OpenDisplay();

        // Get the whole keyboard state
        char keys[32];
        XQueryKeymap(display, keys);

        sf::priv::CloseDisplay(display);

        // Check our keycode
        return (keys[keycode / 8] & (1 << (keycode % 8))) != 0;
    }

    return false;
}